

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O0

void Macro_smpsModSet(uint arg_count,long *arg_array)

{
  uint uVar1;
  uint uVar2;
  long *arg_array_local;
  uint arg_count_local;
  
  if (arg_count < 4) {
    __assert_fail("arg_count >= 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Clownacy[P]smps2asm2bin/instruction.c"
                  ,0x2d4,"void Macro_smpsModSet(unsigned int, long *)");
  }
  WriteByte(0xf0);
  if ((target_driver < 3) || (2 < source_driver)) {
    if ((target_driver < 3) && (2 < source_driver)) {
      WriteByte((char)*arg_array + 0xff);
      WriteByte((uchar)arg_array[1]);
      WriteByte((uchar)arg_array[2]);
      uVar1 = conv0To256((uint)arg_array[3]);
      uVar2 = conv0To256((uint)arg_array[1]);
      WriteByte((char)(uVar1 / uVar2) + 0xff);
    }
    else {
      WriteByte((uchar)*arg_array);
      WriteByte((uchar)arg_array[1]);
      WriteByte((uchar)arg_array[2]);
      WriteByte((uchar)arg_array[3]);
    }
  }
  else {
    WriteByte((char)*arg_array + '\x01');
    WriteByte((uchar)arg_array[1]);
    WriteByte((uchar)arg_array[2]);
    WriteByte(((char)arg_array[3] + '\x01') * (char)arg_array[1]);
  }
  return;
}

Assistant:

static void Macro_smpsModSet(unsigned int arg_count, long arg_array[])
{
	assert(arg_count >= 4);

	WriteByte(0xF0);

	if (target_driver >= 3 && source_driver < 3)
	{
		WriteByte(arg_array[0] + 1);	// Wait
		WriteByte(arg_array[1]);	// Speed
		WriteByte(arg_array[2]);	// Change
		WriteByte(((arg_array[3] + 1) * arg_array[1]) & 0xFF);	// Step
	}
	else if (target_driver < 3 && source_driver >= 3)
	{
		WriteByte(arg_array[0] - 1);	// Wait
		WriteByte(arg_array[1]);	// Speed
		WriteByte(arg_array[2]);	// Change
		WriteByte(conv0To256(arg_array[3]) / conv0To256(arg_array[1]) - 1);	// Step
	}
	else
	{
		WriteByte(arg_array[0]);	// Wait
		WriteByte(arg_array[1]);	// Speed
		WriteByte(arg_array[2]);	// Change
		WriteByte(arg_array[3]);	// Step
	}
}